

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O3

void __thiscall Database_SegmentBase_Test::TestBody(Database_SegmentBase_Test *this)

{
  AssertHelper *pAVar1;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar2;
  shared_ptr<void> *psVar3;
  int iVar4;
  char *pcVar5;
  database db;
  internal local_190 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  undefined1 local_180 [24];
  unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  local_168;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  Database_SegmentBase_Test *local_158;
  database local_150;
  
  pstore::database::database<pstore::file::in_memory>
            (&local_150,&(this->super_Database).store_.file_,true);
  local_150.vacuum_mode_ = disabled;
  uVar2._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(this->super_Database).store_.buffer_.
         super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_180._0_2_ = 0xffff;
  testing::internal::CmpHelperLE<unsigned_short,unsigned_int>
            (local_190,"std::numeric_limits<pstore::address::segment_type>::max ()",
             "pstore::sat_elements",(unsigned_short *)local_180,&pstore::sat_elements);
  if (local_190[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_180);
    if (local_188 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_188->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_180 + 0x10),kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_database.cpp"
               ,0x59,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_180 + 0x10),(Message *)local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_180 + 0x10));
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_180._0_8_ + 8))();
    }
    if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_188,local_188);
    }
  }
  else {
    if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_188,local_188);
    }
    local_180._8_8_ =
         (this->super_Database).store_.buffer_.
         super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_)->_M_use_count + 1;
      }
    }
    local_180._0_8_ =
         uVar2._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    psVar3 = pstore::storage::segment_base(&local_150.storage_,0);
    testing::internal::CmpHelperEQ<std::shared_ptr<void>,std::shared_ptr<void>>
              (local_190,"std::shared_ptr<void> (store_.buffer (), ptr)",
               "db.storage ().segment_base (0)",(shared_ptr<void> *)local_180,psVar3);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_);
    }
    if (local_190[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_180);
      if (local_188 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_188->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_180 + 0x10),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_database.cpp"
                 ,0x5b,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_180 + 0x10),(Message *)local_180);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_180 + 0x10));
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_180._0_8_ + 8))();
      }
    }
    local_160._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )uVar2._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    local_158 = this;
    if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_188,local_188);
    }
    iVar4 = -0xffff;
    pAVar1 = (AssertHelper *)(local_180 + 0x10);
    do {
      local_180._0_8_ =
           (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      psVar3 = pstore::storage::segment_base(&local_150.storage_,(segment_type)iVar4);
      testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<void>>
                (local_190,"nullptr","db.storage ().segment_base (si)",(void **)local_180,psVar3);
      if (local_190[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_180);
        pcVar5 = "";
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_188->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (pAVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_database.cpp"
                   ,0x5e,pcVar5);
        testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_180);
        testing::internal::AssertHelper::~AssertHelper(pAVar1);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_180._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_180._0_8_ + 8))();
        }
      }
      if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_188,local_188);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
    local_180._0_8_ =
         local_160._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    local_180._8_8_ =
         (local_158->super_Database).store_.buffer_.
         super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_)->_M_use_count + 1;
      }
    }
    pstore::storage::segment_base((storage *)(local_180 + 0x10),(short)&local_150 + 8);
    testing::internal::CmpHelperEQ<std::shared_ptr<void>,std::shared_ptr<void_const>>
              (local_190,"std::shared_ptr<void> (store_.buffer (), ptr)",
               "dbp->storage ().segment_base (0)",(shared_ptr<void> *)local_180,
               (shared_ptr<const_void> *)(local_180 + 0x10));
    if ((tuple<pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
         )local_168._M_t.
          super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
          .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl !=
        (_Head_base<0UL,_pstore::system_page_size_interface_*,_false>)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_168._M_t.
                 super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
                 .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_);
    }
    if (local_190[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_180);
      if (local_188 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_188->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_180 + 0x10),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_database.cpp"
                 ,100,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_180 + 0x10),(Message *)local_180);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_180 + 0x10));
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_180._0_8_ + 8))();
      }
    }
    if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_188,local_188);
    }
    iVar4 = -0xffff;
    pAVar1 = (AssertHelper *)(local_180 + 0x10);
    do {
      local_180._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pstore::storage::segment_base((storage *)local_180,(short)&local_150 + 8);
      testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<void_const>>
                (local_190,"nullptr","dbp->storage ().segment_base (si)",(void **)pAVar1,
                 (shared_ptr<const_void> *)local_180);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_);
      }
      if (local_190[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_180);
        pcVar5 = "";
        if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_188->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (pAVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_database.cpp"
                   ,0x67,pcVar5);
        testing::internal::AssertHelper::operator=(pAVar1,(Message *)local_180);
        testing::internal::AssertHelper::~AssertHelper(pAVar1);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_180._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_180._0_8_ + 8))();
        }
      }
      if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_188,local_188);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
  }
  pstore::database::~database(&local_150);
  return;
}

Assistant:

TEST_F (Database, SegmentBase) {
    // Checks that the first segment address is equal to the address of our file backing store
    // buffer, and that all of the other segment pointers are null.

    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    static_assert (pstore::address::segment_size == pstore::storage::min_region_size,
                   "expected min_region_size == segment_size");

    auto ptr = store_.buffer ().get ();

    ASSERT_LE (std::numeric_limits<pstore::address::segment_type>::max (), pstore::sat_elements);

    EXPECT_EQ (std::shared_ptr<void> (store_.buffer (), ptr), db.storage ().segment_base (0));
    for (unsigned segment = 1; segment < pstore::sat_elements; ++segment) {
        auto const si = static_cast<pstore::address::segment_type> (segment);
        EXPECT_EQ (nullptr, db.storage ().segment_base (si));
    }

    // Now the same tests, but for the const method.
    auto const * dbp = &db;

    EXPECT_EQ (std::shared_ptr<void> (store_.buffer (), ptr), dbp->storage ().segment_base (0));
    for (unsigned segment = 1; segment < pstore::sat_elements; ++segment) {
        auto const si = static_cast<pstore::address::segment_type> (segment);
        EXPECT_EQ (nullptr, dbp->storage ().segment_base (si));
    }
}